

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O3

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  ushort uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_4_3_cc401a1e_for_u *paVar9;
  uint8_t *puVar10;
  ulong uVar11;
  byte bVar12;
  ushort uVar13;
  float fVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint8_t *puVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  uint8_t *puVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  size_t *psVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  size_t sVar36;
  ulong uVar37;
  uint8_t *puVar38;
  uint8_t *puVar39;
  bool bVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  ulong local_f0;
  
  uVar1 = pos + block_start;
  sVar15 = max_backward_limit;
  if (uVar1 < max_backward_limit) {
    sVar15 = uVar1;
  }
  uVar7 = uVar1 + params->stream_offset;
  if (max_backward_limit <= uVar7) {
    uVar7 = max_backward_limit;
  }
  iVar3 = params->quality;
  uVar16 = 0x96;
  if (10 < iVar3) {
    uVar16 = 0x145;
  }
  sVar36 = (params->dictionary).compound.total_size;
  EvaluateNode(params->stream_offset + block_start,pos,max_backward_limit,sVar36,starting_dist_cache
               ,model,queue,nodes);
  uVar8 = 2;
  if (pos + 2 <= num_bytes) {
    uVar8 = (ulong)((-(int)queue->idx_ & 7U) << 5);
    fVar42 = (model->literal_costs_[pos] -
             model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar8 - 8))]) +
             *(float *)((long)queue->q_[0].distance_cache + uVar8 + 0x14) + model->min_cost_cmd_;
    paVar9 = &nodes[pos + 2].u;
    lVar24 = 4;
    uVar30 = 10;
    uVar11 = 2;
    do {
      uVar8 = uVar11;
      if (fVar42 < paVar9->cost) break;
      uVar8 = uVar11 + 1;
      bVar40 = uVar8 == uVar30;
      fVar14 = fVar42 + 1.0;
      if (!bVar40) {
        fVar14 = fVar42;
      }
      fVar42 = fVar14;
      lVar17 = 0;
      if (bVar40) {
        lVar17 = lVar24;
      }
      lVar24 = lVar24 << bVar40;
      uVar30 = uVar30 + lVar17;
      paVar9 = paVar9 + 4;
      lVar17 = pos + uVar11;
      uVar11 = uVar8;
    } while (lVar17 + 1U <= num_bytes);
  }
  uVar30 = sVar36 + uVar7;
  puVar10 = ringbuffer + (uVar1 & ringbuffer_mask);
  uVar34 = num_bytes - pos;
  local_f0 = 0;
  uVar11 = 0;
  while( true ) {
    uVar18 = queue->idx_;
    uVar28 = 8;
    if (uVar18 < 8) {
      uVar28 = uVar18;
    }
    if (uVar28 <= uVar11) {
      return local_f0;
    }
    uVar28 = (ulong)(((int)uVar11 - (int)uVar18 & 7U) << 5);
    uVar18 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar28 - 8));
    fVar14 = (float)uVar18;
    fVar42 = fVar14;
    if (5 < uVar18) {
      if (uVar18 < 0x82) {
        uVar29 = 0x1f;
        uVar22 = (uint)(uVar18 - 2);
        if (uVar22 != 0) {
          for (; uVar22 >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        fVar42 = (float)((int)(uVar18 - 2 >> ((char)(uVar29 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar29 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar18 < 0x842) {
        uVar29 = 0x1f;
        if ((int)fVar14 - 0x42U != 0) {
          for (; (int)fVar14 - 0x42U >> uVar29 == 0; uVar29 = uVar29 - 1) {
          }
        }
        fVar42 = (float)((uVar29 ^ 0xffe0) + 0x2a);
      }
      else {
        fVar42 = 2.94273e-44;
        if (0x1841 < uVar18) {
          fVar42 = (float)(uint)(ushort)(0x17 - (uVar18 < 0x5842));
        }
      }
    }
    uVar29 = (uint)fVar42 & 0xffff;
    fVar41 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)*(uint *)(duckdb_brotli::kBrotliInsExtra + (ulong)uVar29 * 4) +
             *(float *)((long)queue->q_[0].distance_cache + uVar28 + 0x10);
    if (uVar8 - 1 < uVar34) break;
LAB_01d3519f:
    if (uVar11 < 2 && num_matches != 0) {
      sVar36 = 0;
      uVar18 = uVar8;
      do {
        BVar4 = matches[sVar36];
        uVar37 = (ulong)BVar4 & 0xffffffff;
        uVar28 = uVar37 + 0xf;
        uVar19 = (ulong)(params->dist).num_direct_distance_codes;
        uVar35 = uVar19 + 0x10;
        if (uVar35 <= uVar28) {
          uVar22 = (params->dist).distance_postfix_bits;
          bVar12 = (byte)uVar22;
          uVar28 = ~uVar19 + uVar37 + (4L << (bVar12 & 0x3f));
          uVar23 = 0x1f;
          uVar26 = (uint)uVar28;
          if (uVar26 != 0) {
            for (; uVar26 >> uVar23 == 0; uVar23 = uVar23 - 1) {
            }
          }
          uVar19 = (ulong)((uVar23 ^ 0xffffffe0) + 0x1f);
          lVar24 = uVar19 - uVar22;
          uVar28 = (~(-1 << (bVar12 & 0x1f)) & uVar26) + uVar35 +
                   ((ulong)((uVar28 >> (uVar19 & 0x3f) & 1) != 0) + lVar24 * 2 + -2 <<
                   (bVar12 & 0x3f)) | lVar24 * 0x400;
        }
        uVar19 = (ulong)BVar4 >> 0x25;
        uVar35 = uVar19;
        if (uVar19 < uVar18) {
          uVar35 = uVar18;
        }
        if (uVar16 < uVar19) {
          uVar18 = uVar35;
        }
        uVar20 = uVar18;
        if (uVar30 < uVar37) {
          uVar20 = uVar35;
        }
        uVar18 = uVar20;
        if (uVar20 <= uVar19) {
          fVar2 = model->cost_dist_[(uint)uVar28 & 0x3ff];
          uVar35 = (ulong)(BVar4.length_and_code & 0x1f);
          if (((ulong)BVar4 & 0x1f00000000) == 0) {
            uVar35 = uVar19;
          }
          uVar18 = uVar19 + 1;
          paVar9 = &nodes[pos + uVar20].u;
          lVar24 = uVar20 * 0x2000000 + 0x12000000;
          do {
            uVar19 = uVar20;
            if (uVar30 < uVar37) {
              uVar19 = uVar35;
            }
            iVar27 = (int)uVar19;
            if (uVar19 < 10) {
              uVar22 = iVar27 - 2;
            }
            else if (uVar19 < 0x86) {
              uVar22 = 0x1f;
              uVar23 = (uint)(uVar19 - 6);
              if (uVar23 != 0) {
                for (; uVar23 >> uVar22 == 0; uVar22 = uVar22 - 1) {
                }
              }
              uVar22 = (int)(uVar19 - 6 >> ((char)(uVar22 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar22 ^ 0xffffffe0) * 2 + 0x42;
            }
            else {
              uVar22 = 0x17;
              if (uVar19 < 0x846) {
                uVar22 = 0x1f;
                if (iVar27 - 0x46U != 0) {
                  for (; iVar27 - 0x46U >> uVar22 == 0; uVar22 = uVar22 - 1) {
                  }
                }
                uVar22 = (uVar22 ^ 0xffe0) + 0x2c;
              }
            }
            iVar33 = ((uVar22 & 0xffff) >> 3) + (uVar29 >> 3) * 3;
            fVar43 = (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra + (ulong)(uVar22 & 0xffff) * 4
                                     ) + (float)((uint)(uVar28 >> 10) & 0x3f) + fVar41 + fVar2 +
                     model->cost_cmd_
                     [(0x520d40U >> ((char)iVar33 * '\x02' & 0x1fU) & 0xc0) + iVar33 * 0x40 +
                      (uVar22 & 7 | ((uint)fVar42 & 7) << 3) + 0x40 & 0xffff];
            if (fVar43 < paVar9->cost) {
              ((ZopfliNode *)(paVar9 + -3))->length =
                   (uint)uVar20 | (int)lVar24 + iVar27 * -0x2000000;
              paVar9[-2].next = BVar4.distance;
              paVar9[-1].next = (uint32_t)fVar14;
              paVar9->cost = fVar43;
              if (local_f0 <= uVar20) {
                local_f0 = uVar20;
              }
            }
            uVar20 = uVar20 + 1;
            paVar9 = paVar9 + 4;
            lVar24 = lVar24 + 0x2000000;
          } while (uVar18 != uVar20);
        }
        sVar36 = sVar36 + 1;
      } while (sVar36 != num_matches);
    }
    if (iVar3 < 0xb) {
      return local_f0;
    }
    bVar40 = 3 < uVar11;
    uVar11 = uVar11 + 1;
    if (bVar40) {
      return local_f0;
    }
  }
  uVar5 = SUB42(fVar42,0) * 8 & 0x38;
  uVar35 = 0;
  uVar18 = uVar8 - 1;
LAB_01d34e03:
  uVar19 = (uVar1 & ringbuffer_mask) + uVar18;
  if (uVar19 <= ringbuffer_mask) {
    uVar37 = (long)kDistanceCacheOffset[uVar35] +
             (long)*(int *)((long)queue->q_[0].distance_cache +
                           (ulong)kDistanceCacheIndex[uVar35] * 4 + uVar28);
    if (uVar30 < uVar37) goto LAB_01d35177;
    if (uVar37 <= sVar15) {
      if (uVar1 <= uVar1 - uVar37) goto LAB_01d35177;
      uVar32 = uVar1 - uVar37 & ringbuffer_mask;
      uVar20 = uVar32 + uVar18;
      if ((ringbuffer_mask < uVar20) || (ringbuffer[uVar19] != ringbuffer[uVar20]))
      goto LAB_01d35177;
      puVar21 = ringbuffer + uVar32;
      puVar25 = puVar10;
      uVar19 = uVar34;
      puVar38 = puVar21;
      if (7 < uVar34) {
        uVar20 = 0;
LAB_01d34f5e:
        if (*(ulong *)(puVar10 + uVar20) == *(ulong *)(puVar21 + uVar20)) goto code_r0x01d34f6b;
        uVar19 = *(ulong *)(puVar21 + uVar20) ^ *(ulong *)(puVar10 + uVar20);
        lVar24 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        uVar22 = (uint)lVar24;
        goto LAB_01d34feb;
      }
      goto LAB_01d34f8d;
    }
    if (uVar7 < uVar37) {
      uVar20 = (params->dictionary).compound.total_size + uVar7;
      psVar31 = (params->dictionary).compound.chunk_offsets;
      do {
        psVar31 = psVar31 + 1;
      } while (*psVar31 + uVar37 <= uVar20);
      uVar32 = *psVar31 + (uVar37 - uVar20);
      if (uVar34 <= uVar32) {
        uVar32 = uVar34;
      }
      if ((uVar32 <= uVar18) ||
         (puVar21 = (uint8_t *)psVar31[-0x11] + (uVar20 - (psVar31[-1] + uVar37)),
         ringbuffer[uVar19] != puVar21[uVar18])) goto LAB_01d35177;
      puVar25 = puVar10;
      puVar38 = puVar21;
      if (7 < uVar32) {
        uVar20 = 0;
        uVar19 = uVar32;
LAB_01d34ed6:
        if (*(ulong *)(puVar10 + uVar20) == *(ulong *)(puVar21 + uVar20)) goto code_r0x01d34ee7;
        uVar19 = *(ulong *)(puVar21 + uVar20) ^ *(ulong *)(puVar10 + uVar20);
        lVar24 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        uVar22 = (uint)lVar24;
LAB_01d34feb:
        uVar20 = (uVar22 >> 3) + uVar20;
        goto LAB_01d34ff2;
      }
      goto LAB_01d34fb1;
    }
    goto LAB_01d35177;
  }
  goto LAB_01d3519f;
code_r0x01d34f6b:
  uVar19 = uVar19 - 8;
  uVar20 = uVar20 + 8;
  if (uVar19 < 8) goto code_r0x01d34f79;
  goto LAB_01d34f5e;
code_r0x01d34f79:
  puVar39 = puVar21 + uVar20;
  if ((pos - num_bytes) + uVar20 != 0) {
    puVar25 = puVar10 + uVar20;
    puVar38 = puVar39;
LAB_01d34f8d:
    puVar39 = puVar38 + uVar19;
    uVar20 = 0;
    do {
      if (puVar38[uVar20] != puVar25[uVar20]) {
        puVar39 = puVar38 + uVar20;
        break;
      }
      uVar20 = uVar20 + 1;
    } while (uVar19 != uVar20);
  }
LAB_01d34fd6:
  uVar20 = (long)puVar39 - (long)puVar21;
LAB_01d34ff2:
  if (uVar18 + 1 <= uVar20) {
    fVar2 = model->cost_dist_[uVar35];
    paVar9 = &nodes[pos + uVar18 + 1].u;
    uVar19 = uVar18;
    do {
      uVar18 = uVar19 + 1;
      iVar27 = (int)uVar19;
      if (uVar18 < 10) {
        uVar22 = iVar27 - 1;
LAB_01d350a7:
        uVar6 = (ushort)uVar22;
        uVar13 = uVar6 & 7 | uVar5;
        if (0xf < uVar6 || (uVar35 != 0 || 7 < SUB42(fVar42,0))) goto LAB_01d350cf;
        uVar13 = uVar6 & 7 | uVar5;
        if (7 < uVar6) {
          uVar13 = uVar13 + 0x40;
        }
      }
      else {
        if (uVar18 < 0x86) {
          uVar22 = 0x1f;
          uVar23 = (uint)(uVar19 - 5);
          if (uVar23 != 0) {
            for (; uVar23 >> uVar22 == 0; uVar22 = uVar22 - 1) {
            }
          }
          uVar22 = (int)(uVar19 - 5 >> ((char)(uVar22 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar22 ^ 0xffffffe0) * 2 + 0x42;
          goto LAB_01d350a7;
        }
        uVar22 = 0x17;
        uVar13 = uVar5 | 7;
        if (uVar18 < 0x846) {
          uVar22 = 0x1f;
          if (iVar27 - 0x45U != 0) {
            for (; iVar27 - 0x45U >> uVar22 == 0; uVar22 = uVar22 - 1) {
            }
          }
          uVar22 = (uVar22 ^ 0xffe0) + 0x2c;
          goto LAB_01d350a7;
        }
LAB_01d350cf:
        iVar33 = ((uVar22 & 0xffff) >> 3) + (uVar29 >> 3) * 3;
        uVar13 = uVar13 + ((ushort)(0x520d40 >> ((char)iVar33 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar33 * 0x40 + 0x40;
      }
      fVar43 = fVar41;
      if (0x7f < uVar13) {
        fVar43 = fVar2 + fVar41;
      }
      fVar43 = (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra + (ulong)(uVar22 & 0xffff) * 4) +
               fVar43 + model->cost_cmd_[uVar13];
      if (fVar43 < paVar9->cost) {
        ((ZopfliNode *)(paVar9 + -3))->length = iVar27 + 1U | 0x12000000;
        paVar9[-2].next = (uint32_t)(float)uVar37;
        paVar9[-1].next = (uint)fVar14 | (int)uVar35 * 0x8000000 + 0x8000000U;
        paVar9->cost = fVar43;
        if (local_f0 <= uVar18) {
          local_f0 = uVar18;
        }
      }
      uVar32 = uVar19 + 2;
      paVar9 = paVar9 + 4;
      uVar19 = uVar18;
    } while (uVar32 <= uVar20);
  }
LAB_01d35177:
  if ((0xe < uVar35) || (uVar35 = uVar35 + 1, uVar34 <= uVar18)) goto LAB_01d3519f;
  goto LAB_01d34e03;
code_r0x01d34ee7:
  uVar19 = uVar19 - 8;
  uVar20 = uVar20 + 8;
  if (uVar19 < 8) goto code_r0x01d34ef5;
  goto LAB_01d34ed6;
code_r0x01d34ef5:
  puVar39 = puVar21 + uVar20;
  if (uVar20 != uVar32) {
    puVar25 = puVar10 + uVar20;
    uVar32 = uVar19;
    puVar38 = puVar39;
LAB_01d34fb1:
    puVar39 = puVar38 + uVar32;
    uVar19 = 0;
    do {
      if (puVar38[uVar19] != puVar25[uVar19]) {
        puVar39 = puVar38 + uVar19;
        break;
      }
      uVar19 = uVar19 + 1;
    } while (uVar32 != uVar19);
  }
  goto LAB_01d34fd6;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else if (backward > dictionary_start) {
        size_t d = 0;
        size_t offset;
        size_t limit;
        const uint8_t* source;
        offset = dictionary_start + 1 + addon->total_size - 1;
        while (offset >= backward + addon->chunk_offsets[d + 1]) d++;
        source = addon->chunk_source[d];
        offset = offset - addon->chunk_offsets[d] - backward;
        limit = addon->chunk_offsets[d + 1] - addon->chunk_offsets[d] - offset;
        limit = limit > max_len ? max_len : limit;
        if (best_len >= limit ||
            continuation != source[offset + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&source[offset],
                                       &ringbuffer[cur_ix_masked],
                                       limit);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}